

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void reallymarkobject(global_State *g,GCObject *o)

{
  lu_byte lVar1;
  byte bVar2;
  GCObject *pGVar3;
  Udata *iu;
  
  bVar2 = o->marked;
  while( true ) {
    bVar2 = bVar2 & 0xfc;
    o->marked = bVar2;
    lVar1 = o->tt;
    if (lVar1 != '\a') break;
    pGVar3 = o[1].next;
    if ((pGVar3 != (GCObject *)0x0) && ((pGVar3->marked & 3) != 0)) {
      reallymarkobject(g,pGVar3);
      bVar2 = o->marked;
    }
    o->marked = bVar2 | 4;
    g->GCmemtrav = *(long *)&o[1].tt + g->GCmemtrav + 0x28;
    if ((o->field_0xa & 0x40) == 0) {
      return;
    }
    o = o[2].next;
    bVar2 = o->marked;
    if ((bVar2 & 3) == 0) {
      return;
    }
  }
  switch(lVar1) {
  case '\x04':
    o->marked = bVar2 | 4;
    pGVar3 = (GCObject *)(ulong)(byte)o->field_0xb;
LAB_0011498b:
    g->GCmemtrav = (lu_mem)(&pGVar3[1].marked + g->GCmemtrav);
    return;
  case '\x05':
    o[3].next = g->gray;
    break;
  case '\a':
    return;
  case '\b':
    *(GCObject **)&o[4].tt = g->gray;
    break;
  case '\t':
    o[7].next = g->gray;
    break;
  default:
    if (lVar1 == '\x14') {
      o->marked = bVar2 | 4;
      pGVar3 = o[1].next;
      goto LAB_0011498b;
    }
    if (lVar1 != '&') {
      return;
    }
  case '\x06':
    o[1].next = g->gray;
  }
  g->gray = o;
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
 reentry:
  white2gray(o);
  switch (o->tt) {
    case LUA_TSHRSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->shrlen);
      break;
    }
    case LUA_TLNGSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->u.lnglen);
      break;
    }
    case LUA_TUSERDATA: {
      TValue uvalue;
      markobjectN(g, gco2u(o)->metatable);  /* mark its metatable */
      gray2black(o);
      g->GCmemtrav += sizeudata(gco2u(o));
      getuservalue(g->mainthread, gco2u(o), &uvalue);
      if (valiswhite(&uvalue)) {  /* markvalue(g, &uvalue); */
        o = gcvalue(&uvalue);
        goto reentry;
      }
      break;
    }
    case LUA_TLCL: {
      linkgclist(gco2lcl(o), g->gray);
      break;
    }
    case LUA_TCCL: {
      linkgclist(gco2ccl(o), g->gray);
      break;
    }
    case LUA_TTABLE: {
      linkgclist(gco2t(o), g->gray);
      break;
    }
    case LUA_TTHREAD: {
      linkgclist(gco2th(o), g->gray);
      break;
    }
    case LUA_TPROTO: {
      linkgclist(gco2p(o), g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}